

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void RunPeepholeOptimizations(ExpressionContext *ctx,VmModule *module,VmValue *value)

{
  VmType *pVVar1;
  VmValue *pVVar2;
  VmValue *pVVar3;
  SynIdentifier *pSVar4;
  VmValue *pVVar5;
  VmValue *pVVar6;
  VmModule *pVVar7;
  bool bVar8;
  VmInstructionType VVar9;
  VmConstant *pVVar10;
  VmInstruction *pVVar11;
  VmValue **ppVVar12;
  TypeBase *pTVar13;
  VmConstant *second;
  FunctionData **ppFVar14;
  VmInstruction *pVVar15;
  VmInstruction *cond_1;
  VmInstruction *cond;
  InplaceStr local_188;
  InplaceStr local_178;
  VmFunction *local_168;
  VmFunction *function_1;
  TypeBase *local_158;
  VmConstant *local_150;
  VmConstant *totalOffset_4;
  TypeBase *local_140;
  VmConstant *local_138;
  VmConstant *shiftedTarget;
  VmConstant *addressAsConstant;
  VmConstant *addressOffset;
  VmValue *address_4;
  VmConstant *offset_4;
  VmInstruction *load;
  VmValue *ptr_3;
  VmConstant *totalOffset_3;
  VmConstant *offset_3;
  VmInstruction *address_3;
  VmValue *ptr_2;
  VmConstant *totalOffset_2;
  VmConstant *offset_2;
  VmInstruction *address_2;
  VmValue *ptr_1;
  VmConstant *totalOffset_1;
  VmConstant *offset_1;
  VmInstruction *address_1;
  VmValue *ptr;
  VmConstant *totalOffset;
  VmConstant *offset;
  VmInstruction *address;
  VmConstant *typeIndexConvert;
  VmConstant *typeIndexConstruct;
  VmInstruction *typeidConvert;
  VmInstruction *typeidConstruct;
  VmInstruction *objectConstruct_1;
  VmInstruction *objectConstruct;
  VmInstruction *inst;
  VmInstruction *next_1;
  VmInstruction *curr_1;
  VmBlock *block;
  VmBlock *next;
  VmBlock *curr;
  VmFunction *function;
  VmValue *value_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  function = (VmFunction *)value;
  value_local = (VmValue *)module;
  module_local = (VmModule *)ctx;
  curr = (VmBlock *)getType<VmFunction>(value);
  if (curr == (VmBlock *)0x0) {
    curr_1 = (VmInstruction *)getType<VmBlock>(&function->super_VmValue);
    if ((VmBlock *)curr_1 == (VmBlock *)0x0) {
      objectConstruct = getType<VmInstruction>(&function->super_VmValue);
      if (objectConstruct != (VmInstruction *)0x0) {
        switch(objectConstruct->cmd) {
        case VM_INST_LOAD_BYTE:
        case VM_INST_LOAD_SHORT:
        case VM_INST_LOAD_INT:
        case VM_INST_LOAD_FLOAT:
        case VM_INST_LOAD_DOUBLE:
        case VM_INST_LOAD_LONG:
        case VM_INST_LOAD_STRUCT:
          ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,0);
          offset = (VmConstant *)getType<VmInstruction>(*ppVVar12);
          if ((VmInstruction *)offset != (VmInstruction *)0x0) {
            ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,1);
            totalOffset = getType<VmConstant>(*ppVVar12);
            ptr = (VmValue *)0x0;
            address_1 = (VmInstruction *)
                        anon_unknown.dwarf_c91b1::TryGetMemberAccessPointerAndOffset
                                  ((ExpressionContext *)module_local,(VmInstruction *)offset,
                                   totalOffset,(VmConstant **)&ptr);
            if (address_1 != (VmInstruction *)0x0) {
              anon_unknown.dwarf_c91b1::ChangeInstructionTo
                        ((VmModule *)value_local,objectConstruct,objectConstruct->cmd,
                         (VmValue *)address_1,ptr,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                         (uint *)(value_local[3].users.little + 7));
            }
          }
          break;
        default:
          break;
        case VM_INST_STORE_BYTE:
        case VM_INST_STORE_SHORT:
        case VM_INST_STORE_INT:
        case VM_INST_STORE_FLOAT:
        case VM_INST_STORE_DOUBLE:
        case VM_INST_STORE_LONG:
        case VM_INST_STORE_STRUCT:
          ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,0);
          offset_1 = (VmConstant *)getType<VmInstruction>(*ppVVar12);
          if ((VmInstruction *)offset_1 != (VmInstruction *)0x0) {
            ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,1);
            totalOffset_1 = getType<VmConstant>(*ppVVar12);
            ptr_1 = (VmValue *)0x0;
            pVVar11 = (VmInstruction *)
                      anon_unknown.dwarf_c91b1::TryGetMemberAccessPointerAndOffset
                                ((ExpressionContext *)module_local,(VmInstruction *)offset_1,
                                 totalOffset_1,(VmConstant **)&ptr_1);
            pVVar5 = value_local;
            pVVar15 = objectConstruct;
            pVVar2 = ptr_1;
            if (pVVar11 != (VmInstruction *)0x0) {
              VVar9 = objectConstruct->cmd;
              address_2 = pVVar11;
              ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,2);
              anon_unknown.dwarf_c91b1::ChangeInstructionTo
                        ((VmModule *)pVVar5,pVVar15,VVar9,(VmValue *)pVVar11,pVVar2,*ppVVar12,
                         (VmValue *)0x0,(VmValue *)0x0,(uint *)(value_local[3].users.little + 7));
            }
          }
          break;
        case VM_INST_INDEX_UNSIZED:
          ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,1);
          objectConstruct_1 = getType<VmInstruction>(*ppVVar12);
          if ((objectConstruct_1 != (VmInstruction *)0x0) &&
             (objectConstruct_1->cmd == VM_INST_ARRAY)) {
            ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct_1->arguments,1);
            bVar8 = isType<VmConstant>(*ppVVar12);
            pVVar2 = value_local;
            pVVar15 = objectConstruct;
            if (bVar8) {
              ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct_1->arguments,1);
              pVVar5 = *ppVVar12;
              ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,0);
              pVVar6 = *ppVVar12;
              ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct_1->arguments,0);
              pVVar3 = *ppVVar12;
              ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,2);
              anon_unknown.dwarf_c91b1::ChangeInstructionTo
                        ((VmModule *)pVVar2,pVVar15,VM_INST_INDEX,pVVar5,pVVar6,pVVar3,*ppVVar12,
                         (VmValue *)0x0,(uint *)(value_local[3].users.little + 7));
            }
          }
          break;
        case VM_INST_MEM_COPY:
          ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,0);
          offset_2 = (VmConstant *)getType<VmInstruction>(*ppVVar12);
          if ((VmInstruction *)offset_2 != (VmInstruction *)0x0) {
            ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,1);
            totalOffset_2 = getType<VmConstant>(*ppVVar12);
            ptr_2 = (VmValue *)0x0;
            pVVar11 = (VmInstruction *)
                      anon_unknown.dwarf_c91b1::TryGetMemberAccessPointerAndOffset
                                ((ExpressionContext *)module_local,(VmInstruction *)offset_2,
                                 totalOffset_2,(VmConstant **)&ptr_2);
            pVVar5 = value_local;
            pVVar15 = objectConstruct;
            pVVar2 = ptr_2;
            address_3 = pVVar11;
            if (pVVar11 != (VmInstruction *)0x0) {
              VVar9 = objectConstruct->cmd;
              ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,2);
              pVVar6 = *ppVVar12;
              ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,3);
              pVVar3 = *ppVVar12;
              ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,4);
              anon_unknown.dwarf_c91b1::ChangeInstructionTo
                        ((VmModule *)pVVar5,pVVar15,VVar9,(VmValue *)pVVar11,pVVar2,pVVar6,pVVar3,
                         *ppVVar12,(uint *)(value_local[3].users.little + 7));
            }
          }
          ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,2);
          offset_3 = (VmConstant *)getType<VmInstruction>(*ppVVar12);
          if ((VmInstruction *)offset_3 != (VmInstruction *)0x0) {
            ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,3);
            totalOffset_3 = getType<VmConstant>(*ppVVar12);
            ptr_3 = (VmValue *)0x0;
            load = (VmInstruction *)
                   anon_unknown.dwarf_c91b1::TryGetMemberAccessPointerAndOffset
                             ((ExpressionContext *)module_local,(VmInstruction *)offset_3,
                              totalOffset_3,(VmConstant **)&ptr_3);
            pVVar2 = value_local;
            pVVar15 = objectConstruct;
            if (load != (VmInstruction *)0x0) {
              VVar9 = objectConstruct->cmd;
              ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,0);
              pVVar5 = *ppVVar12;
              ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,1);
              pVVar3 = ptr_3;
              pVVar11 = load;
              pVVar6 = *ppVVar12;
              ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,4);
              anon_unknown.dwarf_c91b1::ChangeInstructionTo
                        ((VmModule *)pVVar2,pVVar15,VVar9,pVVar5,pVVar6,&pVVar11->super_VmValue,
                         pVVar3,*ppVVar12,(uint *)(value_local[3].users.little + 7));
            }
          }
          break;
        case VM_INST_JUMP_Z:
          ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,0);
          pVVar15 = getType<VmInstruction>(*ppVVar12);
          if (pVVar15 != (VmInstruction *)0x0) {
            if (pVVar15->cmd == VM_INST_NOT_EQUAL) {
              ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&pVVar15->arguments,0);
              bVar8 = VmType::operator==(&(*ppVVar12)->type,&VmType::Int);
              if (bVar8) {
                ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&pVVar15->arguments,1);
                bVar8 = VmType::operator==(&(*ppVVar12)->type,&VmType::Int);
                if (bVar8) {
                  ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&pVVar15->arguments,0);
                  bVar8 = IsConstantZero(*ppVVar12);
                  pVVar2 = value_local;
                  pVVar11 = objectConstruct;
                  if (bVar8) {
                    ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&pVVar15->arguments,1);
                    pVVar5 = *ppVVar12;
                    ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,1);
                    pVVar6 = *ppVVar12;
                    ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,2);
                    anon_unknown.dwarf_c91b1::ChangeInstructionTo
                              ((VmModule *)pVVar2,pVVar11,VM_INST_JUMP_Z,pVVar5,pVVar6,*ppVVar12,
                               (VmValue *)0x0,(VmValue *)0x0,
                               (uint *)(value_local[3].users.little + 7));
                    return;
                  }
                  ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&pVVar15->arguments,1);
                  bVar8 = IsConstantZero(*ppVVar12);
                  pVVar2 = value_local;
                  pVVar11 = objectConstruct;
                  if (!bVar8) {
                    return;
                  }
                  ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&pVVar15->arguments,0);
                  pVVar5 = *ppVVar12;
                  ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,1);
                  pVVar6 = *ppVVar12;
                  ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,2);
                  anon_unknown.dwarf_c91b1::ChangeInstructionTo
                            ((VmModule *)pVVar2,pVVar11,VM_INST_JUMP_Z,pVVar5,pVVar6,*ppVVar12,
                             (VmValue *)0x0,(VmValue *)0x0,(uint *)(value_local[3].users.little + 7)
                            );
                  return;
                }
              }
            }
            if (pVVar15->cmd == VM_INST_EQUAL) {
              ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&pVVar15->arguments,0);
              bVar8 = VmType::operator==(&(*ppVVar12)->type,&VmType::Int);
              if (bVar8) {
                ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&pVVar15->arguments,1);
                bVar8 = VmType::operator==(&(*ppVVar12)->type,&VmType::Int);
                if (bVar8) {
                  ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&pVVar15->arguments,0);
                  bVar8 = IsConstantZero(*ppVVar12);
                  pVVar2 = value_local;
                  pVVar11 = objectConstruct;
                  if (bVar8) {
                    ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&pVVar15->arguments,1);
                    pVVar5 = *ppVVar12;
                    ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,1);
                    pVVar6 = *ppVVar12;
                    ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,2);
                    anon_unknown.dwarf_c91b1::ChangeInstructionTo
                              ((VmModule *)pVVar2,pVVar11,VM_INST_JUMP_NZ,pVVar5,pVVar6,*ppVVar12,
                               (VmValue *)0x0,(VmValue *)0x0,
                               (uint *)(value_local[3].users.little + 7));
                  }
                  else {
                    ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&pVVar15->arguments,1);
                    bVar8 = IsConstantZero(*ppVVar12);
                    pVVar2 = value_local;
                    pVVar11 = objectConstruct;
                    if (bVar8) {
                      ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&pVVar15->arguments,0);
                      pVVar5 = *ppVVar12;
                      ppVVar12 = SmallArray<VmValue_*,_4U>::operator[]
                                           (&objectConstruct->arguments,1);
                      pVVar6 = *ppVVar12;
                      ppVVar12 = SmallArray<VmValue_*,_4U>::operator[]
                                           (&objectConstruct->arguments,2);
                      anon_unknown.dwarf_c91b1::ChangeInstructionTo
                                ((VmModule *)pVVar2,pVVar11,VM_INST_JUMP_NZ,pVVar5,pVVar6,*ppVVar12,
                                 (VmValue *)0x0,(VmValue *)0x0,
                                 (uint *)(value_local[3].users.little + 7));
                    }
                  }
                }
              }
            }
          }
          break;
        case VM_INST_JUMP_NZ:
          ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,0);
          pVVar15 = getType<VmInstruction>(*ppVVar12);
          if (pVVar15 != (VmInstruction *)0x0) {
            if (pVVar15->cmd == VM_INST_NOT_EQUAL) {
              ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&pVVar15->arguments,0);
              bVar8 = VmType::operator==(&(*ppVVar12)->type,&VmType::Int);
              if (bVar8) {
                ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&pVVar15->arguments,1);
                bVar8 = VmType::operator==(&(*ppVVar12)->type,&VmType::Int);
                if (bVar8) {
                  ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&pVVar15->arguments,0);
                  bVar8 = IsConstantZero(*ppVVar12);
                  pVVar2 = value_local;
                  pVVar11 = objectConstruct;
                  if (bVar8) {
                    ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&pVVar15->arguments,1);
                    pVVar5 = *ppVVar12;
                    ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,1);
                    pVVar6 = *ppVVar12;
                    ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,2);
                    anon_unknown.dwarf_c91b1::ChangeInstructionTo
                              ((VmModule *)pVVar2,pVVar11,VM_INST_JUMP_NZ,pVVar5,pVVar6,*ppVVar12,
                               (VmValue *)0x0,(VmValue *)0x0,
                               (uint *)(value_local[3].users.little + 7));
                    return;
                  }
                  ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&pVVar15->arguments,1);
                  bVar8 = IsConstantZero(*ppVVar12);
                  pVVar2 = value_local;
                  pVVar11 = objectConstruct;
                  if (!bVar8) {
                    return;
                  }
                  ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&pVVar15->arguments,0);
                  pVVar5 = *ppVVar12;
                  ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,1);
                  pVVar6 = *ppVVar12;
                  ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,2);
                  anon_unknown.dwarf_c91b1::ChangeInstructionTo
                            ((VmModule *)pVVar2,pVVar11,VM_INST_JUMP_NZ,pVVar5,pVVar6,*ppVVar12,
                             (VmValue *)0x0,(VmValue *)0x0,(uint *)(value_local[3].users.little + 7)
                            );
                  return;
                }
              }
            }
            if (pVVar15->cmd == VM_INST_EQUAL) {
              ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&pVVar15->arguments,0);
              bVar8 = VmType::operator==(&(*ppVVar12)->type,&VmType::Int);
              if (bVar8) {
                ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&pVVar15->arguments,1);
                bVar8 = VmType::operator==(&(*ppVVar12)->type,&VmType::Int);
                if (bVar8) {
                  ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&pVVar15->arguments,0);
                  bVar8 = IsConstantZero(*ppVVar12);
                  pVVar2 = value_local;
                  pVVar11 = objectConstruct;
                  if (bVar8) {
                    ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&pVVar15->arguments,1);
                    pVVar5 = *ppVVar12;
                    ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,1);
                    pVVar6 = *ppVVar12;
                    ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,2);
                    anon_unknown.dwarf_c91b1::ChangeInstructionTo
                              ((VmModule *)pVVar2,pVVar11,VM_INST_JUMP_Z,pVVar5,pVVar6,*ppVVar12,
                               (VmValue *)0x0,(VmValue *)0x0,
                               (uint *)(value_local[3].users.little + 7));
                  }
                  else {
                    ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&pVVar15->arguments,1);
                    bVar8 = IsConstantZero(*ppVVar12);
                    pVVar2 = value_local;
                    pVVar11 = objectConstruct;
                    if (bVar8) {
                      ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&pVVar15->arguments,0);
                      pVVar5 = *ppVVar12;
                      ppVVar12 = SmallArray<VmValue_*,_4U>::operator[]
                                           (&objectConstruct->arguments,1);
                      pVVar6 = *ppVVar12;
                      ppVVar12 = SmallArray<VmValue_*,_4U>::operator[]
                                           (&objectConstruct->arguments,2);
                      anon_unknown.dwarf_c91b1::ChangeInstructionTo
                                ((VmModule *)pVVar2,pVVar11,VM_INST_JUMP_Z,pVVar5,pVVar6,*ppVVar12,
                                 (VmValue *)0x0,(VmValue *)0x0,
                                 (uint *)(value_local[3].users.little + 7));
                    }
                  }
                }
              }
            }
          }
          break;
        case VM_INST_CALL:
          ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,0);
          if (((*ppVVar12)->type).type != VM_TYPE_FUNCTION_REF) {
            ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,1);
            local_168 = getType<VmFunction>(*ppVVar12);
            if (local_168 == (VmFunction *)0x0) {
              __assert_fail("function",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1184,
                            "void RunPeepholeOptimizations(ExpressionContext &, VmModule *, VmValue *)"
                           );
            }
            if (local_168->function->functionIndex == 9) {
              ppFVar14 = SmallArray<FunctionData_*,_128U>::operator[]
                                   ((SmallArray<FunctionData_*,_128U> *)
                                    &module_local[1].loadStoreInfo.little[0x18].loadOffset,
                                    local_168->function->functionIndex);
              pSVar4 = (*ppFVar14)->name;
              InplaceStr::InplaceStr(&local_178,"int");
              bVar8 = InplaceStr::operator==(&pSVar4->name,&local_178);
              if (!bVar8) {
                __assert_fail("ctx.functions[function->function->functionIndex]->name->name == InplaceStr(\"int\")"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                              ,0x1188,
                              "void RunPeepholeOptimizations(ExpressionContext &, VmModule *, VmValue *)"
                             );
              }
              ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,3);
              bVar8 = VmType::operator==(&(*ppVVar12)->type,&VmType::Int);
              pVVar2 = value_local;
              pVVar15 = objectConstruct;
              if (!bVar8) {
                __assert_fail("inst->arguments[3]->type == VmType::Int",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                              ,0x1189,
                              "void RunPeepholeOptimizations(ExpressionContext &, VmModule *, VmValue *)"
                             );
              }
              (objectConstruct->super_VmValue).hasSideEffects = false;
              ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,3);
              anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                        ((VmModule *)pVVar2,&pVVar15->super_VmValue,*ppVVar12,
                         (uint *)(value_local[3].users.little + 7));
            }
            else if (local_168->function->functionIndex == 10) {
              ppFVar14 = SmallArray<FunctionData_*,_128U>::operator[]
                                   ((SmallArray<FunctionData_*,_128U> *)
                                    &module_local[1].loadStoreInfo.little[0x18].loadOffset,
                                    local_168->function->functionIndex);
              pSVar4 = (*ppFVar14)->name;
              InplaceStr::InplaceStr(&local_188,"long");
              bVar8 = InplaceStr::operator==(&pSVar4->name,&local_188);
              if (!bVar8) {
                __assert_fail("ctx.functions[function->function->functionIndex]->name->name == InplaceStr(\"long\")"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                              ,0x1191,
                              "void RunPeepholeOptimizations(ExpressionContext &, VmModule *, VmValue *)"
                             );
              }
              ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,3);
              bVar8 = VmType::operator==(&(*ppVVar12)->type,&VmType::Long);
              pVVar2 = value_local;
              pVVar15 = objectConstruct;
              if (!bVar8) {
                __assert_fail("inst->arguments[3]->type == VmType::Long",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                              ,0x1192,
                              "void RunPeepholeOptimizations(ExpressionContext &, VmModule *, VmValue *)"
                             );
              }
              (objectConstruct->super_VmValue).hasSideEffects = false;
              ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,3);
              anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                        ((VmModule *)pVVar2,&pVVar15->super_VmValue,*ppVVar12,
                         (uint *)(value_local[3].users.little + 7));
            }
            else if (local_168->function->functionIndex == 0xc) {
              ppFVar14 = SmallArray<FunctionData_*,_128U>::operator[]
                                   ((SmallArray<FunctionData_*,_128U> *)
                                    &module_local[1].loadStoreInfo.little[0x18].loadOffset,
                                    local_168->function->functionIndex);
              pSVar4 = (*ppFVar14)->name;
              InplaceStr::InplaceStr((InplaceStr *)&cond,"double");
              bVar8 = InplaceStr::operator==(&pSVar4->name,(InplaceStr *)&cond);
              if (!bVar8) {
                __assert_fail("ctx.functions[function->function->functionIndex]->name->name == InplaceStr(\"double\")"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                              ,0x119a,
                              "void RunPeepholeOptimizations(ExpressionContext &, VmModule *, VmValue *)"
                             );
              }
              ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,3);
              bVar8 = VmType::operator==(&(*ppVVar12)->type,&VmType::Double);
              pVVar2 = value_local;
              pVVar15 = objectConstruct;
              if (!bVar8) {
                __assert_fail("inst->arguments[3]->type == VmType::Double",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                              ,0x119b,
                              "void RunPeepholeOptimizations(ExpressionContext &, VmModule *, VmValue *)"
                             );
              }
              (objectConstruct->super_VmValue).hasSideEffects = false;
              ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,3);
              anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                        ((VmModule *)pVVar2,&pVVar15->super_VmValue,*ppVVar12,
                         (uint *)(value_local[3].users.little + 7));
            }
          }
          break;
        case VM_INST_ADD:
          ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,0);
          bVar8 = IsConstantZero(*ppVVar12);
          pVVar2 = value_local;
          pVVar15 = objectConstruct;
          if (bVar8) {
            ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,1);
            anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                      ((VmModule *)pVVar2,&pVVar15->super_VmValue,*ppVVar12,
                       (uint *)(value_local[3].users.little + 7));
          }
          else {
            ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,1);
            bVar8 = IsConstantZero(*ppVVar12);
            pVVar2 = value_local;
            pVVar15 = objectConstruct;
            if (bVar8) {
              ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,0);
              anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                        ((VmModule *)pVVar2,&pVVar15->super_VmValue,*ppVVar12,
                         (uint *)(value_local[3].users.little + 7));
            }
          }
          break;
        case VM_INST_SUB:
          ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,0);
          bVar8 = DoesConstantIntegerMatch(*ppVVar12,0);
          pVVar2 = value_local;
          pVVar15 = objectConstruct;
          if (bVar8) {
            ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,1);
            anon_unknown.dwarf_c91b1::ChangeInstructionTo
                      ((VmModule *)pVVar2,pVVar15,VM_INST_NEG,*ppVVar12,(VmValue *)0x0,
                       (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                       (uint *)(value_local[3].users.little + 7));
          }
          else {
            ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,1);
            bVar8 = IsConstantZero(*ppVVar12);
            pVVar2 = value_local;
            pVVar15 = objectConstruct;
            if (bVar8) {
              ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,0);
              anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                        ((VmModule *)pVVar2,&pVVar15->super_VmValue,*ppVVar12,
                         (uint *)(value_local[3].users.little + 7));
            }
          }
          break;
        case VM_INST_MUL:
          ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,0);
          bVar8 = IsConstantZero(*ppVVar12);
          if (!bVar8) {
            ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,1);
            bVar8 = IsConstantZero(*ppVVar12);
            if (!bVar8) {
              ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,0);
              bVar8 = IsConstantOne(*ppVVar12);
              pVVar2 = value_local;
              pVVar15 = objectConstruct;
              if (bVar8) {
                ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,1);
                anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                          ((VmModule *)pVVar2,&pVVar15->super_VmValue,*ppVVar12,
                           (uint *)(value_local[3].users.little + 7));
                return;
              }
              ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,1);
              bVar8 = IsConstantOne(*ppVVar12);
              pVVar2 = value_local;
              pVVar15 = objectConstruct;
              if (!bVar8) {
                return;
              }
              ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,0);
              anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                        ((VmModule *)pVVar2,&pVVar15->super_VmValue,*ppVVar12,
                         (uint *)(value_local[3].users.little + 7));
              return;
            }
          }
          bVar8 = VmType::operator==(&(objectConstruct->super_VmValue).type,&VmType::Int);
          pVVar2 = value_local;
          pVVar15 = objectConstruct;
          if (bVar8) {
            pVVar10 = CreateConstantInt((Allocator *)value_local[0x24].users.little[1],
                                        (objectConstruct->super_VmValue).source,0);
            anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                      ((VmModule *)pVVar2,&pVVar15->super_VmValue,&pVVar10->super_VmValue,
                       (uint *)(value_local[3].users.little + 7));
          }
          else {
            bVar8 = VmType::operator==(&(objectConstruct->super_VmValue).type,&VmType::Long);
            pVVar2 = value_local;
            pVVar15 = objectConstruct;
            if (bVar8) {
              pVVar10 = CreateConstantLong((Allocator *)value_local[0x24].users.little[1],
                                           (objectConstruct->super_VmValue).source,0);
              anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                        ((VmModule *)pVVar2,&pVVar15->super_VmValue,&pVVar10->super_VmValue,
                         (uint *)(value_local[3].users.little + 7));
            }
          }
          break;
        case VM_INST_LESS:
          ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,0);
          bVar8 = VmType::operator==(&(*ppVVar12)->type,&VmType::Int);
          if (!bVar8) {
            ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,0);
            bVar8 = VmType::operator==(&(*ppVVar12)->type,&VmType::Long);
            if (!bVar8) {
              return;
            }
          }
          ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,0);
          pVVar2 = *ppVVar12;
          ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,1);
          pVVar5 = value_local;
          pVVar15 = objectConstruct;
          if (pVVar2 == *ppVVar12) {
            pVVar10 = CreateConstantInt((Allocator *)value_local[0x24].users.little[1],
                                        (objectConstruct->super_VmValue).source,0);
            anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                      ((VmModule *)pVVar5,&pVVar15->super_VmValue,&pVVar10->super_VmValue,
                       (uint *)(value_local[3].users.little + 7));
          }
          break;
        case VM_INST_GREATER:
          ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,0);
          bVar8 = VmType::operator==(&(*ppVVar12)->type,&VmType::Int);
          if (!bVar8) {
            ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,0);
            bVar8 = VmType::operator==(&(*ppVVar12)->type,&VmType::Long);
            if (!bVar8) {
              return;
            }
          }
          ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,0);
          pVVar2 = *ppVVar12;
          ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,1);
          pVVar5 = value_local;
          pVVar15 = objectConstruct;
          if (pVVar2 == *ppVVar12) {
            pVVar10 = CreateConstantInt((Allocator *)value_local[0x24].users.little[1],
                                        (objectConstruct->super_VmValue).source,0);
            anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                      ((VmModule *)pVVar5,&pVVar15->super_VmValue,&pVVar10->super_VmValue,
                       (uint *)(value_local[3].users.little + 7));
          }
          break;
        case VM_INST_LESS_EQUAL:
          ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,0);
          bVar8 = VmType::operator==(&(*ppVVar12)->type,&VmType::Int);
          if (!bVar8) {
            ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,0);
            bVar8 = VmType::operator==(&(*ppVVar12)->type,&VmType::Long);
            if (!bVar8) {
              return;
            }
          }
          ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,0);
          pVVar2 = *ppVVar12;
          ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,1);
          pVVar5 = value_local;
          pVVar15 = objectConstruct;
          if (pVVar2 == *ppVVar12) {
            pVVar10 = CreateConstantInt((Allocator *)value_local[0x24].users.little[1],
                                        (objectConstruct->super_VmValue).source,1);
            anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                      ((VmModule *)pVVar5,&pVVar15->super_VmValue,&pVVar10->super_VmValue,
                       (uint *)(value_local[3].users.little + 7));
          }
          break;
        case VM_INST_GREATER_EQUAL:
          ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,0);
          bVar8 = VmType::operator==(&(*ppVVar12)->type,&VmType::Int);
          if (!bVar8) {
            ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,0);
            bVar8 = VmType::operator==(&(*ppVVar12)->type,&VmType::Long);
            if (!bVar8) {
              return;
            }
          }
          ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,0);
          pVVar2 = *ppVVar12;
          ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,1);
          pVVar5 = value_local;
          pVVar15 = objectConstruct;
          if (pVVar2 == *ppVVar12) {
            pVVar10 = CreateConstantInt((Allocator *)value_local[0x24].users.little[1],
                                        (objectConstruct->super_VmValue).source,1);
            anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                      ((VmModule *)pVVar5,&pVVar15->super_VmValue,&pVVar10->super_VmValue,
                       (uint *)(value_local[3].users.little + 7));
          }
          break;
        case VM_INST_EQUAL:
          ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,0);
          bVar8 = VmType::operator==(&(*ppVVar12)->type,&VmType::Int);
          if (!bVar8) {
            ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,0);
            bVar8 = VmType::operator==(&(*ppVVar12)->type,&VmType::Long);
            if (!bVar8) {
              return;
            }
          }
          ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,0);
          pVVar2 = *ppVVar12;
          ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,1);
          pVVar5 = value_local;
          pVVar15 = objectConstruct;
          if (pVVar2 == *ppVVar12) {
            pVVar10 = CreateConstantInt((Allocator *)value_local[0x24].users.little[1],
                                        (objectConstruct->super_VmValue).source,1);
            anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                      ((VmModule *)pVVar5,&pVVar15->super_VmValue,&pVVar10->super_VmValue,
                       (uint *)(value_local[3].users.little + 7));
          }
          break;
        case VM_INST_NOT_EQUAL:
          ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,0);
          bVar8 = VmType::operator==(&(*ppVVar12)->type,&VmType::Int);
          if (!bVar8) {
            ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,0);
            bVar8 = VmType::operator==(&(*ppVVar12)->type,&VmType::Long);
            if (!bVar8) {
              return;
            }
          }
          ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,0);
          pVVar2 = *ppVVar12;
          ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,1);
          pVVar5 = value_local;
          pVVar15 = objectConstruct;
          if (pVVar2 == *ppVVar12) {
            pVVar10 = CreateConstantInt((Allocator *)value_local[0x24].users.little[1],
                                        (objectConstruct->super_VmValue).source,0);
            anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                      ((VmModule *)pVVar5,&pVVar15->super_VmValue,&pVVar10->super_VmValue,
                       (uint *)(value_local[3].users.little + 7));
          }
          break;
        case VM_INST_CONVERT_POINTER:
          ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,0);
          typeidConstruct = getType<VmInstruction>(*ppVVar12);
          if ((typeidConstruct != (VmInstruction *)0x0) &&
             (typeidConstruct->cmd == VM_INST_CONSTRUCT)) {
            ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&typeidConstruct->arguments,0);
            typeidConvert = getType<VmInstruction>(*ppVVar12);
            ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,1);
            typeIndexConstruct = (VmConstant *)getType<VmInstruction>(*ppVVar12);
            if ((typeidConvert != (VmInstruction *)0x0) &&
               (((typeidConvert->cmd == VM_INST_TYPE_ID &&
                 ((VmInstruction *)typeIndexConstruct != (VmInstruction *)0x0)) &&
                (((VmInstruction *)typeIndexConstruct)->cmd == VM_INST_TYPE_ID)))) {
              ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&typeidConvert->arguments,0);
              typeIndexConvert = getType<VmConstant>(*ppVVar12);
              ppVVar12 = SmallArray<VmValue_*,_4U>::operator[]
                                   ((SmallArray<VmValue_*,_4U> *)&typeIndexConstruct->dValue,0);
              address = (VmInstruction *)getType<VmConstant>(*ppVVar12);
              pVVar2 = value_local;
              pVVar15 = objectConstruct;
              if (((typeIndexConvert != (VmConstant *)0x0) && (address != (VmInstruction *)0x0)) &&
                 (typeIndexConvert->iValue == address->cmd)) {
                ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&typeidConstruct->arguments,1);
                anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                          ((VmModule *)pVVar2,&pVVar15->super_VmValue,*ppVVar12,
                           (uint *)(value_local[3].users.little + 7));
              }
            }
          }
          break;
        case VM_INST_EXTRACT:
          ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,0);
          offset_4 = (VmConstant *)getType<VmInstruction>(*ppVVar12);
          if ((VmInstruction *)offset_4 != (VmInstruction *)0x0) {
            ppVVar12 = SmallArray<VmValue_*,_4U>::operator[](&objectConstruct->arguments,1);
            address_4 = &getType<VmConstant>(*ppVVar12)->super_VmValue;
            bVar8 = anon_unknown.dwarf_c91b1::IsLoad(&offset_4->super_VmValue);
            if (bVar8) {
              ppVVar12 = SmallArray<VmValue_*,_4U>::operator[]
                                   ((SmallArray<VmValue_*,_4U> *)&offset_4->dValue,0);
              addressOffset = (VmConstant *)*ppVVar12;
              ppVVar12 = SmallArray<VmValue_*,_4U>::operator[]
                                   ((SmallArray<VmValue_*,_4U> *)&offset_4->dValue,1);
              addressAsConstant = getType<VmConstant>(*ppVVar12);
              shiftedTarget = getType<VmConstant>(&addressOffset->super_VmValue);
              if ((shiftedTarget == (VmConstant *)0x0) ||
                 (shiftedTarget->container == (VariableData *)0x0)) {
                local_150 = CreateConstantInt((Allocator *)
                                              module_local[6].loadStoreInfo.little[0xf].loadPointer,
                                              (SynBase *)0x0,
                                              *(int *)&address_4[1]._vptr_VmValue +
                                              addressAsConstant->iValue);
                pVVar7 = module_local;
                pVVar2 = value_local;
                pVVar15 = objectConstruct;
                pVVar1 = &(objectConstruct->super_VmValue).type;
                function_1 = *(VmFunction **)pVVar1;
                local_158 = (objectConstruct->super_VmValue).type.structType;
                pTVar13 = GetBaseType((ExpressionContext *)module_local,*pVVar1);
                VVar9 = anon_unknown.dwarf_c91b1::GetLoadInstruction
                                  ((ExpressionContext *)pVVar7,pTVar13);
                anon_unknown.dwarf_c91b1::ChangeInstructionTo
                          ((VmModule *)pVVar2,pVVar15,VVar9,&addressOffset->super_VmValue,
                           &local_150->super_VmValue,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                           (uint *)(value_local[3].users.little + 7));
              }
              else {
                if (addressAsConstant->iValue != 0) {
                  __assert_fail("addressOffset->iValue == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                                ,0x1170,
                                "void RunPeepholeOptimizations(ExpressionContext &, VmModule *, VmValue *)"
                               );
                }
                local_138 = CreateConstantPointer
                                      ((Allocator *)value_local[0x24].users.little[1],(SynBase *)0x0
                                       ,shiftedTarget->iValue + *(int *)&address_4[1]._vptr_VmValue,
                                       shiftedTarget->container,
                                       (shiftedTarget->super_VmValue).type.structType,true);
                pVVar7 = module_local;
                pVVar2 = value_local;
                pVVar15 = objectConstruct;
                pVVar1 = &(objectConstruct->super_VmValue).type;
                totalOffset_4 = *(VmConstant **)pVVar1;
                local_140 = (objectConstruct->super_VmValue).type.structType;
                pTVar13 = GetBaseType((ExpressionContext *)module_local,*pVVar1);
                VVar9 = anon_unknown.dwarf_c91b1::GetLoadInstruction
                                  ((ExpressionContext *)pVVar7,pTVar13);
                pVVar10 = local_138;
                second = CreateConstantInt((Allocator *)value_local[0x24].users.little[1],
                                           (SynBase *)0x0,0);
                anon_unknown.dwarf_c91b1::ChangeInstructionTo
                          ((VmModule *)pVVar2,pVVar15,VVar9,&pVVar10->super_VmValue,
                           &second->super_VmValue,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                           (uint *)(value_local[3].users.little + 7));
              }
            }
          }
        }
      }
    }
    else {
      next_1 = ((VmBlock *)curr_1)->firstInstruction;
      while (next_1 != (VmInstruction *)0x0) {
        inst = next_1->nextSibling;
        RunPeepholeOptimizations
                  ((ExpressionContext *)module_local,(VmModule *)value_local,&next_1->super_VmValue)
        ;
        next_1 = inst;
      }
    }
  }
  else {
    next = curr->prevSibling;
    while (next != (VmBlock *)0x0) {
      block = next->nextSibling;
      RunPeepholeOptimizations
                ((ExpressionContext *)module_local,(VmModule *)value_local,&next->super_VmValue);
      next = block;
    }
  }
  return;
}

Assistant:

void RunPeepholeOptimizations(ExpressionContext &ctx, VmModule *module, VmValue* value)
{
	if(VmFunction *function = getType<VmFunction>(value))
	{
		VmBlock *curr = function->firstBlock;

		while(curr)
		{
			VmBlock *next = curr->nextSibling;
			RunPeepholeOptimizations(ctx, module, curr);
			curr = next;
		}
	}
	else if(VmBlock *block = getType<VmBlock>(value))
	{
		VmInstruction *curr = block->firstInstruction;

		while(curr)
		{
			VmInstruction *next = curr->nextSibling;
			RunPeepholeOptimizations(ctx, module, curr);
			curr = next;
		}
	}
	else if(VmInstruction *inst = getType<VmInstruction>(value))
	{
		switch(inst->cmd)
		{
		case VM_INST_ADD:
			if(IsConstantZero(inst->arguments[0])) // 0 + x, all types
				ReplaceValueUsersWith(module, inst, inst->arguments[1], &module->peepholeOptimizations);
			else if(IsConstantZero(inst->arguments[1])) // x + 0, all types
				ReplaceValueUsersWith(module, inst, inst->arguments[0], &module->peepholeOptimizations);
			break;
		case VM_INST_SUB:
			if(DoesConstantIntegerMatch(inst->arguments[0], 0)) // 0 - x, integer types
				ChangeInstructionTo(module, inst, VM_INST_NEG, inst->arguments[1], NULL, NULL, NULL, NULL, &module->peepholeOptimizations);
			else if(IsConstantZero(inst->arguments[1])) // x - 0, all types
				ReplaceValueUsersWith(module, inst, inst->arguments[0], &module->peepholeOptimizations);
			break;
		case VM_INST_MUL:
			if(IsConstantZero(inst->arguments[0]) || IsConstantZero(inst->arguments[1])) // 0 * x or x * 0, all integer types (double can be NaN)
			{
				if(inst->type == VmType::Int)
					ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, 0), &module->peepholeOptimizations);
				else if(inst->type == VmType::Long)
					ReplaceValueUsersWith(module, inst, CreateConstantLong(module->allocator, inst->source, 0), &module->peepholeOptimizations);
			}
			else if(IsConstantOne(inst->arguments[0])) // 1 * x, all types
			{
				ReplaceValueUsersWith(module, inst, inst->arguments[1], &module->peepholeOptimizations);
			}
			else if(IsConstantOne(inst->arguments[1])) // x * 1, all types
			{
				ReplaceValueUsersWith(module, inst, inst->arguments[0], &module->peepholeOptimizations);
			}
			break;
		case VM_INST_INDEX_UNSIZED:
			// Try to replace unsized array index with an array index if the type[] is a construct expression
			if(VmInstruction *objectConstruct = getType<VmInstruction>(inst->arguments[1]))
			{
				if(objectConstruct->cmd == VM_INST_ARRAY && isType<VmConstant>(objectConstruct->arguments[1]))
					ChangeInstructionTo(module, inst, VM_INST_INDEX, objectConstruct->arguments[1], inst->arguments[0], objectConstruct->arguments[0], inst->arguments[2], NULL, &module->peepholeOptimizations);
			}
			break;
		case VM_INST_CONVERT_POINTER:
			// Try to replace with a pointer value if auto ref is a construct expression
			if(VmInstruction *objectConstruct = getType<VmInstruction>(inst->arguments[0]))
			{
				if(objectConstruct->cmd == VM_INST_CONSTRUCT)
				{
					VmInstruction *typeidConstruct = getType<VmInstruction>(objectConstruct->arguments[0]);

					VmInstruction *typeidConvert = getType<VmInstruction>(inst->arguments[1]);

					if(typeidConstruct && typeidConstruct->cmd == VM_INST_TYPE_ID && typeidConvert && typeidConvert->cmd == VM_INST_TYPE_ID)
					{
						VmConstant *typeIndexConstruct = getType<VmConstant>(typeidConstruct->arguments[0]);
						VmConstant *typeIndexConvert = getType<VmConstant>(typeidConvert->arguments[0]);

						if(typeIndexConstruct && typeIndexConvert && typeIndexConstruct->iValue == typeIndexConvert->iValue)
							ReplaceValueUsersWith(module, inst, objectConstruct->arguments[1], &module->peepholeOptimizations);
					}
				}
			}
			break;
		case VM_INST_LESS:
			if((inst->arguments[0]->type == VmType::Int || inst->arguments[0]->type == VmType::Long) && inst->arguments[0] == inst->arguments[1])
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, 0), &module->peepholeOptimizations);
			break;
		case VM_INST_GREATER:
			if((inst->arguments[0]->type == VmType::Int || inst->arguments[0]->type == VmType::Long) && inst->arguments[0] == inst->arguments[1])
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, 0), &module->peepholeOptimizations);
			break;
		case VM_INST_LESS_EQUAL:
			if((inst->arguments[0]->type == VmType::Int || inst->arguments[0]->type == VmType::Long) && inst->arguments[0] == inst->arguments[1])
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, 1), &module->peepholeOptimizations);
			break;
		case VM_INST_GREATER_EQUAL:
			if((inst->arguments[0]->type == VmType::Int || inst->arguments[0]->type == VmType::Long) && inst->arguments[0] == inst->arguments[1])
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, 1), &module->peepholeOptimizations);
			break;
		case VM_INST_EQUAL:
			if((inst->arguments[0]->type == VmType::Int || inst->arguments[0]->type == VmType::Long) && inst->arguments[0] == inst->arguments[1])
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, 1), &module->peepholeOptimizations);
			break;
		case VM_INST_NOT_EQUAL:
			if((inst->arguments[0]->type == VmType::Int || inst->arguments[0]->type == VmType::Long) && inst->arguments[0] == inst->arguments[1])
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, 0), &module->peepholeOptimizations);
			break;
			// Try to place address offset into the load/store instruction
		case VM_INST_LOAD_BYTE:
		case VM_INST_LOAD_SHORT:
		case VM_INST_LOAD_INT:
		case VM_INST_LOAD_FLOAT:
		case VM_INST_LOAD_DOUBLE:
		case VM_INST_LOAD_LONG:
		case VM_INST_LOAD_STRUCT:
			if(VmInstruction *address = getType<VmInstruction>(inst->arguments[0]))
			{
				VmConstant *offset = getType<VmConstant>(inst->arguments[1]);

				VmConstant *totalOffset = NULL;

				if(VmValue *ptr = TryGetMemberAccessPointerAndOffset(ctx, address, offset, &totalOffset))
					ChangeInstructionTo(module, inst, inst->cmd, ptr, totalOffset, NULL, NULL, NULL, &module->peepholeOptimizations);
			}
			break;
		case VM_INST_STORE_BYTE:
		case VM_INST_STORE_SHORT:
		case VM_INST_STORE_INT:
		case VM_INST_STORE_FLOAT:
		case VM_INST_STORE_DOUBLE:
		case VM_INST_STORE_LONG:
		case VM_INST_STORE_STRUCT:
			if(VmInstruction *address = getType<VmInstruction>(inst->arguments[0]))
			{
				VmConstant *offset = getType<VmConstant>(inst->arguments[1]);

				VmConstant *totalOffset = NULL;

				if(VmValue *ptr = TryGetMemberAccessPointerAndOffset(ctx, address, offset, &totalOffset))
					ChangeInstructionTo(module, inst, inst->cmd, ptr, totalOffset, inst->arguments[2], NULL, NULL, &module->peepholeOptimizations);
			}
			break;
		case VM_INST_MEM_COPY:
			if(VmInstruction *address = getType<VmInstruction>(inst->arguments[0]))
			{
				VmConstant *offset = getType<VmConstant>(inst->arguments[1]);

				VmConstant *totalOffset = NULL;

				if(VmValue *ptr = TryGetMemberAccessPointerAndOffset(ctx, address, offset, &totalOffset))
					ChangeInstructionTo(module, inst, inst->cmd, ptr, totalOffset, inst->arguments[2], inst->arguments[3], inst->arguments[4], &module->peepholeOptimizations);
			}

			if(VmInstruction *address = getType<VmInstruction>(inst->arguments[2]))
			{
				VmConstant *offset = getType<VmConstant>(inst->arguments[3]);

				VmConstant *totalOffset = NULL;

				if(VmValue *ptr = TryGetMemberAccessPointerAndOffset(ctx, address, offset, &totalOffset))
					ChangeInstructionTo(module, inst, inst->cmd, inst->arguments[0], inst->arguments[1], ptr, totalOffset, inst->arguments[4], &module->peepholeOptimizations);
			}
			break;
		case VM_INST_EXTRACT:
			if(VmInstruction *load = getType<VmInstruction>(inst->arguments[0]))
			{
				VmConstant *offset = getType<VmConstant>(inst->arguments[1]);

				if(IsLoad(load))
				{
					VmValue *address = load->arguments[0];
					VmConstant *addressOffset = getType<VmConstant>(load->arguments[1]);

					VmConstant *addressAsConstant = getType<VmConstant>(address);

					if (addressAsConstant && addressAsConstant->container)
					{
						assert(addressOffset->iValue == 0);

						VmConstant *shiftedTarget = CreateConstantPointer(module->allocator, NULL, addressAsConstant->iValue + offset->iValue, addressAsConstant->container, addressAsConstant->type.structType, true);

						ChangeInstructionTo(module, inst, GetLoadInstruction(ctx, GetBaseType(ctx, inst->type)), shiftedTarget, CreateConstantInt(module->allocator, NULL, 0), NULL, NULL, NULL, &module->peepholeOptimizations);
					}
					else
					{
						VmConstant *totalOffset = CreateConstantInt(ctx.allocator, NULL, offset->iValue + addressOffset->iValue);

						ChangeInstructionTo(module, inst, GetLoadInstruction(ctx, GetBaseType(ctx, inst->type)), address, totalOffset, NULL, NULL, NULL, &module->peepholeOptimizations);
					}
				}
			}
			break;
		case VM_INST_CALL:
			if(inst->arguments[0]->type.type != VM_TYPE_FUNCTION_REF)
			{
				VmFunction *function = getType<VmFunction>(inst->arguments[1]);

				assert(function);

				if(function->function->functionIndex == 0x09)
				{
					assert(ctx.functions[function->function->functionIndex]->name->name == InplaceStr("int"));
					assert(inst->arguments[3]->type == VmType::Int);

					inst->hasSideEffects = false;

					ReplaceValueUsersWith(module, inst, inst->arguments[3], &module->peepholeOptimizations);
				}
				else if(function->function->functionIndex == 0x0a)
				{
					assert(ctx.functions[function->function->functionIndex]->name->name == InplaceStr("long"));
					assert(inst->arguments[3]->type == VmType::Long);

					inst->hasSideEffects = false;

					ReplaceValueUsersWith(module, inst, inst->arguments[3], &module->peepholeOptimizations);
				}
				else if(function->function->functionIndex == 0x0c)
				{
					assert(ctx.functions[function->function->functionIndex]->name->name == InplaceStr("double"));
					assert(inst->arguments[3]->type == VmType::Double);

					inst->hasSideEffects = false;

					ReplaceValueUsersWith(module, inst, inst->arguments[3], &module->peepholeOptimizations);
				}
			}
			break;
		case VM_INST_JUMP_NZ:
			if(VmInstruction *cond = getType<VmInstruction>(inst->arguments[0]))
			{
				if(cond->cmd == VM_INST_NOT_EQUAL && cond->arguments[0]->type == VmType::Int && cond->arguments[1]->type == VmType::Int)
				{
					if(IsConstantZero(cond->arguments[0]))
						ChangeInstructionTo(module, inst, VM_INST_JUMP_NZ, cond->arguments[1], inst->arguments[1], inst->arguments[2], NULL, NULL, &module->peepholeOptimizations);
					else if(IsConstantZero(cond->arguments[1]))
						ChangeInstructionTo(module, inst, VM_INST_JUMP_NZ, cond->arguments[0], inst->arguments[1], inst->arguments[2], NULL, NULL, &module->peepholeOptimizations);
				}
				else if(cond->cmd == VM_INST_EQUAL && cond->arguments[0]->type == VmType::Int && cond->arguments[1]->type == VmType::Int)
				{
					if(IsConstantZero(cond->arguments[0]))
						ChangeInstructionTo(module, inst, VM_INST_JUMP_Z, cond->arguments[1], inst->arguments[1], inst->arguments[2], NULL, NULL, &module->peepholeOptimizations);
					else if(IsConstantZero(cond->arguments[1]))
						ChangeInstructionTo(module, inst, VM_INST_JUMP_Z, cond->arguments[0], inst->arguments[1], inst->arguments[2], NULL, NULL, &module->peepholeOptimizations);
				}
			}
			break;
		case VM_INST_JUMP_Z:
			if(VmInstruction *cond = getType<VmInstruction>(inst->arguments[0]))
			{
				if(cond->cmd == VM_INST_NOT_EQUAL && cond->arguments[0]->type == VmType::Int && cond->arguments[1]->type == VmType::Int)
				{
					if(IsConstantZero(cond->arguments[0]))
						ChangeInstructionTo(module, inst, VM_INST_JUMP_Z, cond->arguments[1], inst->arguments[1], inst->arguments[2], NULL, NULL, &module->peepholeOptimizations);
					else if(IsConstantZero(cond->arguments[1]))
						ChangeInstructionTo(module, inst, VM_INST_JUMP_Z, cond->arguments[0], inst->arguments[1], inst->arguments[2], NULL, NULL, &module->peepholeOptimizations);
				}
				else if(cond->cmd == VM_INST_EQUAL && cond->arguments[0]->type == VmType::Int && cond->arguments[1]->type == VmType::Int)
				{
					if(IsConstantZero(cond->arguments[0]))
						ChangeInstructionTo(module, inst, VM_INST_JUMP_NZ, cond->arguments[1], inst->arguments[1], inst->arguments[2], NULL, NULL, &module->peepholeOptimizations);
					else if(IsConstantZero(cond->arguments[1]))
						ChangeInstructionTo(module, inst, VM_INST_JUMP_NZ, cond->arguments[0], inst->arguments[1], inst->arguments[2], NULL, NULL, &module->peepholeOptimizations);
				}
			}
			break;
		default:
			break;
		}
	}
}